

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_converter.hpp
# Opt level: O2

type * __thiscall
jsoncons::
value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
::convert<char>(type *__return_storage_ptr__,
               value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
               *this,basic_string_view<char,_std::char_traits<char>_> *value,semantic_tag tag,
               error_code *ec)

{
  undefined3 in_register_00000009;
  int iVar1;
  type tVar2;
  
  iVar1 = CONCAT31(in_register_00000009,tag);
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar1 == 0xc) {
    decode_base64url<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
              (value->_M_str,value->_M_str + value->_M_len,__return_storage_ptr__);
  }
  else if (iVar1 == 9) {
    decode_base64<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
              (value->_M_str,value->_M_str + value->_M_len,__return_storage_ptr__);
  }
  else {
    if ((iVar1 == 8) &&
       (tVar2 = decode_base16<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
                          (value->_M_str,value->_M_str + value->_M_len,__return_storage_ptr__),
       tVar2.ec == success)) {
      return __return_storage_ptr__;
    }
    std::error_code::operator=(ec,not_byte_string);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<ext_traits::is_narrow_character<CharT>::value,Into>::type
        convert(const From& value, semantic_tag tag, std::error_code& ec)
        {
            Into bytes(this->get_allocator());
            switch (tag)
            {
                case semantic_tag::base16:
                {
                    auto res = decode_base16(value.begin(), value.end(), bytes);
                    if (res.ec != conv_errc::success)
                    {
                        ec = conv_errc::not_byte_string;
                    }
                    break;
                }
                case semantic_tag::base64:
                {
                    decode_base64(value.begin(), value.end(), bytes);
                    break;
                }
                case semantic_tag::base64url:
                {
                    decode_base64url(value.begin(), value.end(), bytes);
                    break;
                }
                default:
                {
                    ec = conv_errc::not_byte_string;
                    break;
                }
            }
            return bytes;
        }